

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O1

ktx_error_code_e ktxFileStream_skip(ktxStream *str,ktx_size_t count)

{
  int iVar1;
  ktx_error_code_e unaff_EBP;
  ulong uVar2;
  bool bVar3;
  
  if (str == (ktxStream *)0x0) {
    unaff_EBP = KTX_INVALID_VALUE;
  }
  else {
    if (str->type != eStreamTypeFile) {
      __assert_fail("str->type == eStreamTypeFile",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                    ,0x7c,"ktx_error_code_e ktxFileStream_skip(ktxStream *, const ktx_size_t)");
    }
    bVar3 = count != 0;
    if (bVar3) {
      uVar2 = 1;
      do {
        iVar1 = getc((FILE *)(str->data).file);
        if (iVar1 == -1) {
          iVar1 = feof((FILE *)(str->data).file);
          unaff_EBP = (uint)(iVar1 != 0) * 2 + KTX_FILE_READ_ERROR;
          break;
        }
        bVar3 = uVar2 < count;
        uVar2 = (ulong)((int)uVar2 + 1);
      } while (bVar3);
    }
    if (!bVar3) {
      str->readpos = str->readpos + count;
      unaff_EBP = KTX_SUCCESS;
    }
  }
  return unaff_EBP;
}

Assistant:

static
KTX_error_code ktxFileStream_skip(ktxStream* str, const ktx_size_t count)
{
    if (!str)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeFile);

    for (ktx_uint32_t i = 0; i < count; i++) {
        int ret = getc(str->data.file);
        if (ret == EOF) {
            if (feof(str->data.file)) {
                return KTX_FILE_UNEXPECTED_EOF;
            } else {
                return KTX_FILE_READ_ERROR;
            }
        }
    }
    str->readpos += count;

    return KTX_SUCCESS;
}